

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsp_helper.c
# Opt level: O2

target_ulong_conflict
helper_addwc_mips(target_ulong_conflict rs,target_ulong_conflict rt,CPUMIPSState_conflict *env)

{
  uint uVar1;
  ulong uVar2;
  
  uVar1 = (env->active_tc).DSPControl;
  uVar2 = (long)(int)rt + (long)(int)rs + (ulong)((uVar1 >> 0xd & 1) != 0);
  if (((uint)(uVar2 >> 0x1f) & 1) != (uint)((uVar2 >> 0x20 & 1) != 0)) {
    (env->active_tc).DSPControl = uVar1 | 0x100000;
  }
  return (target_ulong_conflict)uVar2;
}

Assistant:

target_ulong helper_addwc(target_ulong rs, target_ulong rt, CPUMIPSState *env)
{
    uint32_t rd;
    int32_t temp32, temp31;
    int64_t tempL;

    tempL = (int64_t)(int32_t)rs + (int64_t)(int32_t)rt +
        get_DSPControl_carryflag(env);
    temp31 = (tempL >> 31) & 0x01;
    temp32 = (tempL >> 32) & 0x01;

    if (temp31 != temp32) {
        set_DSPControl_overflow_flag(1, 20, env);
    }

    rd = tempL & MIPSDSP_LLO;

    return (target_long)(int32_t)rd;
}